

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_specialization_info
          (Impl *this,VkSpecializationInfo *info,ScratchAllocator *alloc,
          VkSpecializationInfo **out_info)

{
  VkSpecializationMapEntry *__src;
  void *__src_00;
  uint32_t uVar1;
  undefined4 uVar2;
  VkSpecializationInfo *pVVar3;
  VkSpecializationMapEntry *pVVar4;
  void *pvVar5;
  ptrdiff_t _Num;
  size_t sVar6;
  
  pVVar3 = (VkSpecializationInfo *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (pVVar3 != (VkSpecializationInfo *)0x0) {
    uVar1 = info->mapEntryCount;
    uVar2 = *(undefined4 *)&info->field_0x4;
    pVVar4 = info->pMapEntries;
    pvVar5 = info->pData;
    pVVar3->dataSize = info->dataSize;
    pVVar3->pData = pvVar5;
    pVVar3->mapEntryCount = uVar1;
    *(undefined4 *)&pVVar3->field_0x4 = uVar2;
    pVVar3->pMapEntries = pVVar4;
  }
  if ((ulong)pVVar3->mapEntryCount == 0) {
    pVVar4 = (VkSpecializationMapEntry *)0x0;
  }
  else {
    __src = pVVar3->pMapEntries;
    sVar6 = (ulong)pVVar3->mapEntryCount << 4;
    pVVar4 = (VkSpecializationMapEntry *)ScratchAllocator::allocate_raw(alloc,sVar6,0x10);
    if (pVVar4 != (VkSpecializationMapEntry *)0x0) {
      memmove(pVVar4,__src,sVar6);
    }
  }
  pVVar3->pMapEntries = pVVar4;
  sVar6 = pVVar3->dataSize;
  if (sVar6 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    __src_00 = pVVar3->pData;
    pvVar5 = ScratchAllocator::allocate_raw(alloc,sVar6,0x10);
    if (pvVar5 != (void *)0x0) {
      memmove(pvVar5,__src_00,sVar6);
    }
  }
  pVVar3->pData = pvVar5;
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_specialization_info(const VkSpecializationInfo *info, ScratchAllocator &alloc,
                                                   const VkSpecializationInfo **out_info)
{
	auto *ret = copy(info, 1, alloc);
	ret->pMapEntries = copy(ret->pMapEntries, ret->mapEntryCount, alloc);
	ret->pData = copy(static_cast<const uint8_t *>(ret->pData), ret->dataSize, alloc);

	*out_info = ret;
	return true;
}